

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

string * __thiscall
pbrt::ParameterDictionary::GetOneString
          (string *__return_storage_ptr__,ParameterDictionary *this,string *name,string *def)

{
  pointer pcVar1;
  ReturnType local_48;
  
  pcVar1 = (def->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + def->_M_string_length);
  lookupSingle<(pbrt::ParameterType)9>(__return_storage_ptr__,this,name,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::GetOneString(const std::string &name,
                                              const std::string &def) const {
    return lookupSingle<ParameterType::String>(name, def);
}